

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteEscapedString(BinaryWriterSpec *this,string_view s)

{
  byte c_00;
  size_type sVar1;
  byte *pbVar2;
  ulong uStack_28;
  uint8_t c;
  size_t i;
  BinaryWriterSpec *this_local;
  string_view s_local;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (BinaryWriterSpec *)s._M_len;
  Stream::WriteChar(this->json_stream_,'\"',(char *)0x0,No);
  uStack_28 = 0;
  while( true ) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar1 <= uStack_28) break;
    pbVar2 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                                uStack_28);
    c_00 = *pbVar2;
    if (((c_00 < 0x20) || (c_00 == 0x5c)) || (c_00 == 0x22)) {
      Stream::Writef(this->json_stream_,"\\u%04x",(ulong)c_00);
    }
    else {
      Stream::WriteChar(this->json_stream_,c_00,(char *)0x0,No);
    }
    uStack_28 = uStack_28 + 1;
  }
  Stream::WriteChar(this->json_stream_,'\"',(char *)0x0,No);
  return;
}

Assistant:

void BinaryWriterSpec::WriteEscapedString(std::string_view s) {
  json_stream_->WriteChar('"');
  for (size_t i = 0; i < s.length(); ++i) {
    uint8_t c = s[i];
    if (c < 0x20 || c == '\\' || c == '"') {
      json_stream_->Writef("\\u%04x", c);
    } else {
      json_stream_->WriteChar(c);
    }
  }
  json_stream_->WriteChar('"');
}